

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O1

void Acb_ObjPatchFanin(Acb_Ntk_t *p,int iObj,int iFanin,int iFaninNew)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int *piVar9;
  int iVar10;
  bool bVar11;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  if ((p->vObjFans).nSize <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar1 = (p->vObjFans).pArray[(uint)iObj];
  if (((int)uVar1 < 0) || ((p->vFanSto).nSize <= (int)uVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  if (iFanin == iFaninNew) {
    __assert_fail("iFanin != iFaninNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0x229,"void Acb_ObjPatchFanin(Acb_Ntk_t *, int, int, int)");
  }
  piVar9 = (p->vFanSto).pArray;
  if (0 < piVar9[uVar1]) {
    lVar8 = 0;
    do {
      if (piVar9[(ulong)uVar1 + lVar8 + 1] == iFanin) {
        piVar9[(ulong)uVar1 + lVar8 + 1] = iFaninNew;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < piVar9[uVar1]);
  }
  if ((p->vFanouts).nSize < 1) {
    return;
  }
  if ((-1 < iFanin) && (iFanin < (p->vFanouts).nSize)) {
    pVVar2 = (p->vFanouts).pArray;
    uVar1 = pVVar2[(uint)iFanin].nSize;
    uVar7 = 0;
    bVar11 = 0 < (int)uVar1;
    if (0 < (int)uVar1) {
      bVar11 = true;
      if (*pVVar2[(uint)iFanin].pArray != iObj) {
        uVar5 = 0;
        do {
          if ((ulong)uVar1 - 1 == uVar5) {
            bVar11 = false;
            uVar7 = (ulong)uVar1;
            goto LAB_003a7de1;
          }
          uVar7 = uVar5 + 1;
          lVar8 = uVar5 + 1;
          uVar5 = uVar7;
        } while (pVVar2[(uint)iFanin].pArray[lVar8] != iObj);
        bVar11 = uVar7 < uVar1;
      }
    }
LAB_003a7de1:
    uVar6 = (uint)uVar7;
    if (uVar6 != uVar1) {
      if (!bVar11) {
        __assert_fail("i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
      }
      uVar4 = uVar1;
      if ((int)(uVar6 + 1) < (int)uVar1) {
        piVar3 = pVVar2[(uint)iFanin].pArray;
        piVar9 = piVar3 + (uVar6 + 1);
        uVar7 = uVar7 & 0xffffffff;
        do {
          iVar10 = (int)uVar7;
          piVar3[uVar7] = *piVar9;
          uVar4 = pVVar2[(uint)iFanin].nSize;
          piVar9 = piVar9 + 1;
          uVar7 = (ulong)(iVar10 + 1);
        } while (iVar10 + 2 < (int)uVar4);
      }
      pVVar2[(uint)iFanin].nSize = uVar4 - 1;
      if (uVar6 != uVar1) {
        if ((-1 < iFaninNew) && (iFaninNew < (p->vFanouts).nSize)) {
          Vec_IntPush(pVVar2 + (uint)iFaninNew,iObj);
          return;
        }
        goto LAB_003a7e5f;
      }
    }
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0x230,"void Acb_ObjPatchFanin(Acb_Ntk_t *, int, int, int)");
  }
LAB_003a7e5f:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

static inline void Acb_ObjPatchFanin( Acb_Ntk_t * p, int iObj, int iFanin, int iFaninNew )
{
    int i, RetValue, * pFanins = Acb_ObjFanins( p, iObj );
    assert( iFanin != iFaninNew );
    for ( i = 0; i < pFanins[0]; i++ )
        if ( pFanins[ 1 + i ] == iFanin )
            pFanins[ 1 + i ] = iFaninNew;
    if ( !Acb_NtkHasObjFanout(p) )
        return;
    RetValue = Vec_IntRemove( Vec_WecEntry(&p->vFanouts, iFanin), iObj );
    assert( RetValue );
    Vec_IntPush( Vec_WecEntry(&p->vFanouts, iFaninNew), iObj );
}